

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O3

vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct>::ConvertToStruct
          (vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *__return_storage_ptr__
          ,JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct> *this)

{
  pointer pPVar1;
  pointer this_00;
  PsbtBip32DataStruct data;
  PsbtBip32DataStruct local_e0;
  
  (__return_storage_ptr__->
  super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_JsonVector<cfd::api::json::PsbtBip32Data>).
            super_vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>
            .
            super__Vector_base<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (this->super_JsonVector<cfd::api::json::PsbtBip32Data>).
           super_vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>
           .
           super__Vector_base<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pPVar1) {
    do {
      cfd::api::json::PsbtBip32Data::ConvertToStruct(&local_e0,this_00);
      ::std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::push_back
                (__return_storage_ptr__,&local_e0);
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_e0.ignore_items._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.descriptor._M_dataplus._M_p != &local_e0.descriptor.field_2) {
        operator_delete(local_e0.descriptor._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.path._M_dataplus._M_p != &local_e0.path.field_2) {
        operator_delete(local_e0.path._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.master_fingerprint._M_dataplus._M_p != &local_e0.master_fingerprint.field_2) {
        operator_delete(local_e0.master_fingerprint._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.pubkey._M_dataplus._M_p != &local_e0.pubkey.field_2) {
        operator_delete(local_e0.pubkey._M_dataplus._M_p);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pPVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }